

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::AnalyzeTapScriptTreeInfo::AnalyzeTapScriptTreeInfo
          (AnalyzeTapScriptTreeInfo *this)

{
  AnalyzeTapScriptTreeInfo *this_local;
  
  core::JsonClassBase<cfd::js::api::json::AnalyzeTapScriptTreeInfo>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::AnalyzeTapScriptTreeInfo>);
  (this->super_JsonClassBase<cfd::js::api::json::AnalyzeTapScriptTreeInfo>)._vptr_JsonClassBase =
       (_func_int **)&PTR__AnalyzeTapScriptTreeInfo_01b46a08;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  core::
  JsonObjectVector<cfd::js::api::json::TapScriptTreeItem,_cfd::js::api::TapScriptTreeItemStruct>::
  JsonObjectVector(&this->branches_);
  CollectFieldName();
  return;
}

Assistant:

AnalyzeTapScriptTreeInfo() {
    CollectFieldName();
  }